

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::qdxt1::create_selector_clusters
          (qdxt1 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  dxt1_block *this_00;
  weighted_vec *pwVar4;
  uint weight;
  uint cMaxWeight;
  uint cColorDistToWeight;
  uint dist;
  color_quad_u8 second_color;
  color_quad_u8 first_color;
  uint x;
  uint y;
  float *pDst;
  vec16F sv;
  dxt1_block *dxt1_block;
  undefined1 local_30 [4];
  uint block_iter;
  weighted_selector_vec_array selector_vecs;
  vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices_local;
  uint max_selector_clusters_local;
  qdxt1 *this_local;
  
  this->m_progress_start = this->m_progress_range;
  this->m_progress_range = 0x21;
  selector_vecs._8_8_ = selector_cluster_indices;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::vector
            ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
             local_30,this->m_num_blocks);
  for (dxt1_block._4_4_ = 0; dxt1_block._4_4_ < this->m_num_blocks;
      dxt1_block._4_4_ = dxt1_block._4_4_ + 1) {
    this_00 = get_block(this,dxt1_block._4_4_);
    vec<16U,_float>::vec((vec<16U,_float> *)((long)&pDst + 4));
    _x = vec<16U,_float>::operator[]((vec<16U,_float> *)((long)&pDst + 4),0);
    for (first_color.field_0 =
              (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
              (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
               )0x0; (uint)first_color.field_0 < 4;
        first_color.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             ((int)first_color.field_0 + 1)) {
      for (second_color.field_0 =
                (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                 )0x0; (uint)second_color.field_0 < 4;
          second_color.field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
               ((int)second_color.field_0 + 1)) {
        uVar2 = crnlib::dxt1_block::get_selector
                          (this_00,(uint)second_color.field_0,(uint)first_color.field_0);
        *_x = (float)*(byte *)((long)&g_dxt1_to_linear + (ulong)uVar2);
        _x = _x + 1;
      }
    }
    uVar2 = crnlib::dxt1_block::get_low_color(this_00);
    crnlib::dxt1_block::unpack_color((dxt1_block *)&dist,(uint16)uVar2,true,0xff);
    uVar2 = crnlib::dxt1_block::get_high_color(this_00);
    crnlib::dxt1_block::unpack_color((dxt1_block *)&cColorDistToWeight,(uint16)uVar2,true,0xff);
    uVar2 = crnlib::color::color_distance
                      ((bool)((this->m_params).m_perceptual & 1),(color_quad_u8 *)&dist,
                       (color_quad_u8 *)&cColorDistToWeight,false);
    uVar3 = math::clamp<unsigned_int>(uVar2 / 2000,1,0x800);
    pwVar4 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
             operator[]((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         *)local_30,dxt1_block._4_4_);
    vec<16U,_float>::operator=(&pwVar4->m_vec,(vec<16U,_float> *)((long)&pDst + 4));
    pwVar4 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
             operator[]((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         *)local_30,dxt1_block._4_4_);
    pwVar4->m_weight = uVar3;
  }
  bVar1 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                    (&this->m_selector_clusterizer,(weighted_vec_array *)local_30,
                     max_selector_clusters,
                     (vector<crnlib::vector<unsigned_int>_> *)selector_vecs._8_8_,
                     generate_codebook_progress_callback,this);
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::~vector
            ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
             local_30);
  return bVar1;
}

Assistant:

bool qdxt1::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices)
    {
        m_progress_start = m_progress_range;
        m_progress_range = 33;

        weighted_selector_vec_array selector_vecs(m_num_blocks);

        for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++)
        {
            dxt1_block& dxt1_block = get_block(block_iter);

            vec16F sv;
            float* pDst = &sv[0];

            for (uint y = 0; y < 4; y++)
            {
                for (uint x = 0; x < 4; x++)
                {
                    *pDst++ = g_dxt1_to_linear[dxt1_block.get_selector(x, y)];
                }
            }

            const color_quad_u8 first_color(dxt1_block::unpack_color((uint16)dxt1_block.get_low_color(), true));
            const color_quad_u8 second_color(dxt1_block::unpack_color((uint16)dxt1_block.get_high_color(), true));
            const uint dist = color::color_distance(m_params.m_perceptual, first_color, second_color, false);

            const uint cColorDistToWeight = 2000;
            const uint cMaxWeight = 2048;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            selector_vecs[block_iter].m_vec = sv;
            selector_vecs[block_iter].m_weight = weight;
        }

        return m_selector_clusterizer.create_clusters(
            selector_vecs, max_selector_clusters, selector_cluster_indices, generate_codebook_progress_callback, this);
    }